

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::MergePartialFromCodedStream
          (BayesianProbitRegressor_FeatureWeight *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  Type *this_00;
  pair<int,_int> pVar7;
  int64 iVar8;
  int iVar9;
  int byte_limit;
  ulong uVar10;
  int iVar11;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003cd478;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003cd478:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar5 = (uint32)uVar10;
    iVar11 = 6;
    iVar9 = iVar11;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003cd506:
      iVar9 = 7;
      if ((uVar5 & 7) != 4 && uVar5 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_003cd525:
        iVar9 = iVar11;
        if (bVar4 != false) goto LAB_003cd52c;
      }
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar10 != '\x12') goto LAB_003cd506;
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
                            (&(this->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3))
        {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < byte_limit;
        }
        if (((bVar4) &&
            (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,byte_limit), -1 < (long)pVar7)) &&
           (bVar4 = BayesianProbitRegressor_FeatureValueWeight::MergePartialFromCodedStream
                              (this_00,input), bVar4)) {
          bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar7.first);
          goto LAB_003cd525;
        }
      }
      else {
        if ((uVar6 != 1) || ((char)uVar10 != '\b')) goto LAB_003cd506;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar5 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->featureid_ = (uint)bVar1;
            input->buffer_ = pbVar2 + 1;
            goto LAB_003cd52c;
          }
        }
        else {
          uVar5 = 0;
        }
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        this->featureid_ = (uint32)iVar8;
        if (-1 < iVar8) {
LAB_003cd52c:
          iVar9 = 0;
        }
      }
    }
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool BayesianProbitRegressor_FeatureWeight::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 featureId = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &featureid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  return false;
#undef DO_
}